

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

xmlCatalogEntryPtr
xmlParseXMLCatalogOneNode
          (xmlNodePtr cur,xmlCatalogEntryType type,xmlChar *name,xmlChar *attrName,
          xmlChar *uriAttrName,xmlCatalogPrefer prefer,xmlCatalogEntryPtr cgroup)

{
  bool bVar1;
  xmlChar *name_00;
  xmlChar *URI;
  xmlChar *base;
  xmlChar *URL;
  xmlCatalogEntryPtr pxVar2;
  
  bVar1 = true;
  if (attrName != (xmlChar *)0x0) {
    name_00 = xmlGetProp(cur,attrName);
    if (name_00 != (xmlChar *)0x0) goto LAB_001668b6;
    bVar1 = false;
    xmlCatalogErr((xmlCatalogEntryPtr)0x0,cur,0x672,"%s entry lacks \'%s\'\n",name,attrName,
                  (xmlChar *)0x0);
  }
  name_00 = (xmlChar *)0x0;
LAB_001668b6:
  URI = xmlGetProp(cur,uriAttrName);
  if (URI == (xmlChar *)0x0) {
    bVar1 = false;
    xmlCatalogErr((xmlCatalogEntryPtr)0x0,cur,0x672,"%s entry lacks \'%s\'\n",name,uriAttrName,
                  (xmlChar *)0x0);
  }
  if (bVar1) {
    base = xmlNodeGetBase(cur->doc,cur);
    URL = xmlBuildURI(URI,base);
    if (URL == (xmlChar *)0x0) {
      pxVar2 = (xmlCatalogEntryPtr)0x0;
      xmlCatalogErr((xmlCatalogEntryPtr)0x0,cur,0x673,"%s entry \'%s\' broken ?: %s\n",name,
                    uriAttrName,URI);
    }
    else {
      if (1 < xmlDebugCatalogs) {
        if (name_00 == (xmlChar *)0x0) {
          xmlCatalogPrintDebug("Found %s: \'%s\'\n",name,URL);
        }
        else {
          xmlCatalogPrintDebug("Found %s: \'%s\' \'%s\'\n",name,name_00,URL);
        }
      }
      pxVar2 = xmlNewCatalogEntry(type,name_00,URI,URL,prefer,cgroup);
    }
    if (name_00 != (xmlChar *)0x0) {
      (*xmlFree)(name_00);
    }
    if (URI != (xmlChar *)0x0) {
      (*xmlFree)(URI);
    }
    if (base != (xmlChar *)0x0) {
      (*xmlFree)(base);
    }
  }
  else {
    if (name_00 != (xmlChar *)0x0) {
      (*xmlFree)(name_00);
    }
    pxVar2 = (xmlCatalogEntryPtr)0x0;
    URL = URI;
  }
  if (URL != (xmlChar *)0x0) {
    (*xmlFree)(URL);
  }
  return pxVar2;
}

Assistant:

static xmlCatalogEntryPtr
xmlParseXMLCatalogOneNode(xmlNodePtr cur, xmlCatalogEntryType type,
			  const xmlChar *name, const xmlChar *attrName,
			  const xmlChar *uriAttrName, xmlCatalogPrefer prefer,
			  xmlCatalogEntryPtr cgroup) {
    int ok = 1;
    xmlChar *uriValue;
    xmlChar *nameValue = NULL;
    xmlChar *base = NULL;
    xmlChar *URL = NULL;
    xmlCatalogEntryPtr ret = NULL;

    if (attrName != NULL) {
	nameValue = xmlGetProp(cur, attrName);
	if (nameValue == NULL) {
	    xmlCatalogErr(ret, cur, XML_CATALOG_MISSING_ATTR,
			  "%s entry lacks '%s'\n", name, attrName, NULL);
	    ok = 0;
	}
    }
    uriValue = xmlGetProp(cur, uriAttrName);
    if (uriValue == NULL) {
	xmlCatalogErr(ret, cur, XML_CATALOG_MISSING_ATTR,
		"%s entry lacks '%s'\n", name, uriAttrName, NULL);
	ok = 0;
    }
    if (!ok) {
	if (nameValue != NULL)
	    xmlFree(nameValue);
	if (uriValue != NULL)
	    xmlFree(uriValue);
	return(NULL);
    }

    base = xmlNodeGetBase(cur->doc, cur);
    URL = xmlBuildURI(uriValue, base);
    if (URL != NULL) {
	if (xmlDebugCatalogs > 1) {
	    if (nameValue != NULL)
		xmlCatalogPrintDebug(
			"Found %s: '%s' '%s'\n", name, nameValue, URL);
	    else
		xmlCatalogPrintDebug(
			"Found %s: '%s'\n", name, URL);
	}
	ret = xmlNewCatalogEntry(type, nameValue, uriValue, URL, prefer, cgroup);
    } else {
	xmlCatalogErr(ret, cur, XML_CATALOG_ENTRY_BROKEN,
		"%s entry '%s' broken ?: %s\n", name, uriAttrName, uriValue);
    }
    if (nameValue != NULL)
	xmlFree(nameValue);
    if (uriValue != NULL)
	xmlFree(uriValue);
    if (base != NULL)
	xmlFree(base);
    if (URL != NULL)
	xmlFree(URL);
    return(ret);
}